

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void wasm::destroyAllTypesForTestingPurposesOnly(void)

{
  HeapTypeInfo *this;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer *__ptr;
  undefined8 *puVar3;
  
  std::
  _Hashtable<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::hash<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::hash<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)((anonymous_namespace)::globalTupleStore + 0x40));
  std::
  vector<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>_>
  ::_M_erase_at_end((vector<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>_>
                     *)((anonymous_namespace)::globalTupleStore + 0x28),
                    (pointer)(anonymous_namespace)::globalTupleStore._40_8_);
  puVar2 = DAT_010b26d0;
  puVar1 = (anonymous_namespace)::globalHeapTypeStore;
  puVar3 = (anonymous_namespace)::globalHeapTypeStore;
  if (DAT_010b26d0 != (anonymous_namespace)::globalHeapTypeStore) {
    do {
      this = (HeapTypeInfo *)*puVar3;
      if (this != (HeapTypeInfo *)0x0) {
        anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(this);
        operator_delete(this,0x50);
      }
      *puVar3 = 0;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
    DAT_010b26d0 = puVar1;
  }
  std::
  _Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)((anonymous_namespace)::globalRecGroupStore + 0x28));
  std::
  vector<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ::_M_erase_at_end((vector<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
                     *)((anonymous_namespace)::globalRecGroupStore + 0x60),
                    (pointer)(anonymous_namespace)::globalRecGroupStore._96_8_);
  return;
}

Assistant:

void destroyAllTypesForTestingPurposesOnly() {
  globalTupleStore.clear();
  globalHeapTypeStore.clear();
  globalRecGroupStore.clear();
}